

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int skip_sfx(archive_read *a,ssize_t bytes_avail)

{
  long lVar1;
  int iVar2;
  int64_t iVar3;
  _7zip *zip;
  ulong uStack_58;
  int step;
  ssize_t window;
  ssize_t bytes;
  size_t offset;
  size_t skip;
  char *q;
  char *p;
  void *h;
  ssize_t bytes_avail_local;
  archive_read *a_local;
  
  h = (void *)bytes_avail;
  bytes_avail_local = (ssize_t)a;
  if (bytes_avail < 0x27001) {
    iVar3 = __archive_read_seek(a,0x27000,0);
    if (iVar3 < 0) {
      return -0x1e;
    }
  }
  else {
    __archive_read_consume(a,0x27000);
  }
  bytes = 0;
  uStack_58 = 1;
  do {
    while( true ) {
      if (0x39000 < bytes + uStack_58) goto LAB_00e1b791;
      p = (char *)__archive_read_ahead((archive_read *)bytes_avail_local,uStack_58,&window);
      if (p == (char *)0x0) break;
      if (window < 6) {
        uStack_58 = 0x1000;
      }
      else {
        skip = (size_t)(p + window);
        for (q = p; q + 0x20 < skip; q = q + iVar2) {
          iVar2 = check_7zip_header_in_sfx(q);
          if (iVar2 == 0) {
            lVar1 = **(long **)(bytes_avail_local + 0x818);
            offset = (long)q - (long)p;
            __archive_read_consume((archive_read *)bytes_avail_local,offset);
            *(size_t *)(lVar1 + 0x88) = bytes + 0x27000 + offset;
            return 0;
          }
        }
        offset = (long)q - (long)p;
        __archive_read_consume((archive_read *)bytes_avail_local,offset);
        bytes = offset + bytes;
        if (uStack_58 == 1) {
          uStack_58 = 0x1000;
        }
      }
    }
    uStack_58 = (long)uStack_58 >> 1;
  } while (0x3f < uStack_58);
LAB_00e1b791:
  archive_set_error((archive *)bytes_avail_local,0x54,"Couldn\'t find out 7-Zip header");
  return -0x1e;
}

Assistant:

static int
skip_sfx(struct archive_read *a, ssize_t bytes_avail)
{
	const void *h;
	const char *p, *q;
	size_t skip, offset;
	ssize_t bytes, window;

	/*
	 * If bytes_avail > SFX_MIN_ADDR we do not have to call
	 * __archive_read_seek() at this time since we have
	 * already had enough data.
	 */
	if (bytes_avail > SFX_MIN_ADDR)
		__archive_read_consume(a, SFX_MIN_ADDR);
	else if (__archive_read_seek(a, SFX_MIN_ADDR, SEEK_SET) < 0)
		return (ARCHIVE_FATAL);

	offset = 0;
	window = 1;
	while (offset + window <= SFX_MAX_ADDR - SFX_MIN_ADDR) {
		h = __archive_read_ahead(a, window, &bytes);
		if (h == NULL) {
			/* Remaining bytes are less than window. */
			window >>= 1;
			if (window < 0x40)
				goto fatal;
			continue;
		}
		if (bytes < 6) {
			/* This case might happen when window == 1. */
			window = 4096;
			continue;
		}
		p = (const char *)h;
		q = p + bytes;

		/*
		 * Scan ahead until we find something that looks
		 * like the 7-Zip header.
		 */
		while (p + 32 < q) {
			int step = check_7zip_header_in_sfx(p);
			if (step == 0) {
				struct _7zip *zip =
				    (struct _7zip *)a->format->data;
				skip = p - (const char *)h;
				__archive_read_consume(a, skip);
				zip->seek_base = SFX_MIN_ADDR + offset + skip;
				return (ARCHIVE_OK);
			}
			p += step;
		}
		skip = p - (const char *)h;
		__archive_read_consume(a, skip);
		offset += skip;
		if (window == 1)
			window = 4096;
	}
fatal:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Couldn't find out 7-Zip header");
	return (ARCHIVE_FATAL);
}